

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory_method.cpp
# Opt level: O3

ostream * operator<<(ostream *out,Point *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(x = ",5);
  poVar1 = std::ostream::_M_insert<double>((double)p->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", y = ",6);
  poVar1 = std::ostream::_M_insert<double>((double)p->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Point& p)
	{
		return out << "(x = " << p.x << ", y = " << p.y << ")";
	}